

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountingStorageItemRegister.hpp
# Opt level: O3

int __thiscall
supermap::
CountingStorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_unsigned_long,_void>
::clone(CountingStorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_unsigned_long,_void>
        *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  _func_int *p_Var1;
  _func_int *in_RAX;
  _func_int **pp_Var2;
  _func_int *local_28;
  
  local_28 = in_RAX;
  pp_Var2 = (_func_int **)operator_new(0x18);
  p_Var1 = *(_func_int **)(__fn + 8);
  (**(code **)**(undefined8 **)(__fn + 0x10))(&local_28);
  *pp_Var2 = (_func_int *)&PTR_clone_00126878;
  pp_Var2[1] = p_Var1;
  pp_Var2[2] = local_28;
  (this->
  super_StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>
  ).
  super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>_>
  ._vptr_Cloneable = pp_Var2;
  return (int)this;
}

Assistant:

std::unique_ptr<StorageItemRegister<T, CountingStorageInfo<IndexT, AdditionalInfo>>>
    clone() const override {
        return std::unique_ptr<CountingStorageItemRegister<T, IndexT, AdditionalInfo>>(
            new CountingStorageItemRegister(count_,
                                            innerRegister_->clone())
        );
    }